

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int propagateConstants(Parse *pParse,Select *p)

{
  SrcList *pSVar1;
  long in_FS_OFFSET;
  Walker w;
  WhereConst x;
  undefined1 local_98 [32];
  undefined1 *local_78;
  anon_union_8_18_67db040d_for_u aStack_70;
  Parse *local_68;
  u8 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  void *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_70.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &pParse->db->mallocFailed;
  local_68 = pParse;
  do {
    local_58 = 0;
    local_48 = (void *)0x0;
    pSVar1 = p->pSrc;
    if (((pSVar1 == (SrcList *)0x0) || (pSVar1->nSrc < 1)) ||
       ((pSVar1->a[0].fg.jointype & 0x40) == 0)) {
      uStack_50 = 0x100000000;
    }
    else {
      uStack_50 = 0x300000000;
    }
    findConstInWhere(((NameContext *)&local_68).pConst,p->pWhere);
    if ((int)local_58 != 0) {
      local_98._8_8_ = propagateConstantExprRewrite;
      local_98._16_8_ = sqlite3SelectWalkNoop;
      local_98._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_78 = (undefined1 *)0x0;
      local_98._0_8_ = pParse;
      aStack_70.pNC = ((NameContext *)&local_68).pNC;
      if (p->pWhere != (Expr *)0x0) {
        sqlite3WalkExprNN((Walker *)local_98,p->pWhere);
      }
      if (local_48 != (void *)0x0) {
        sqlite3DbFreeNN(local_68->db,local_48);
      }
    }
  } while (local_58._4_4_ != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

static int propagateConstants(
  Parse *pParse,   /* The parsing context */
  Select *p        /* The query in which to propagate constants */
){
  WhereConst x;
  Walker w;
  int nChng = 0;
  x.pParse = pParse;
  x.pOomFault = &pParse->db->mallocFailed;
  do{
    x.nConst = 0;
    x.nChng = 0;
    x.apExpr = 0;
    x.bHasAffBlob = 0;
    if( ALWAYS(p->pSrc!=0)
     && p->pSrc->nSrc>0
     && (p->pSrc->a[0].fg.jointype & JT_LTORJ)!=0
    ){
      /* Do not propagate constants on any ON clause if there is a
      ** RIGHT JOIN anywhere in the query */
      x.mExcludeOn = EP_InnerON | EP_OuterON;
    }else{
      /* Do not propagate constants through the ON clause of a LEFT JOIN */
      x.mExcludeOn = EP_OuterON;
    }
    findConstInWhere(&x, p->pWhere);
    if( x.nConst ){
      memset(&w, 0, sizeof(w));
      w.pParse = pParse;
      w.xExprCallback = propagateConstantExprRewrite;
      w.xSelectCallback = sqlite3SelectWalkNoop;
      w.xSelectCallback2 = 0;
      w.walkerDepth = 0;
      w.u.pConst = &x;
      sqlite3WalkExpr(&w, p->pWhere);
      sqlite3DbFree(x.pParse->db, x.apExpr);
      nChng += x.nChng;
    }
  }while( x.nChng );
  return nChng;
}